

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O1

void __thiscall tst_qpromise_filter::functorThrows(tst_qpromise_filter *this)

{
  QSharedData *pQVar1;
  PromiseResolver<QList<int>_> PVar2;
  char16_t *pcVar3;
  bool bVar4;
  PromiseData<QList<int>_> *pPVar5;
  QPromiseReject<QList<int>_> *reject;
  QByteArrayView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_e0;
  QPromise<QList<int>_> p;
  PromiseResolver<QList<int>_> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_c0;
  QString local_b8;
  QString local_a0;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  QArrayData *local_60;
  storage_type_conflict *local_58;
  qsizetype local_50;
  _Any_data local_48;
  code *local_38;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_58 = (storage_type_conflict *)QArrayData::allocate(&local_60,4,8,3,KeepSize);
  local_58[0] = L'*';
  local_58[1] = L'\0';
  local_58[2] = L'+';
  local_58[3] = L'\0';
  local_58[4] = L',';
  local_58[5] = L'\0';
  local_50 = 3;
  QtPromise::QPromiseBase<QList<int>_>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            ((QPromiseBase<QList<int>_> *)&local_b8,(QList<int> *)&local_60);
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0014b458;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b428;
  pPVar5 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0014b508;
  QReadWriteLock::QReadWriteLock
            (&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0014b490;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a0.d.d = (Data *)&PTR__QPromiseBase_0014b458;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar5;
  local_a0.d.ptr = (char16_t *)pPVar5;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)&local_a0);
  local_a0.d.d = (Data *)&PTR__QPromiseBase_0014b428;
  if ((PromiseData<QList<int>_> *)local_a0.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_a0.d.ptr)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_a0.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_a0.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  pcVar3 = local_b8.d.ptr;
  PVar2.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_e0 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_c0 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  local_88._M_unused._0_8_)->d = (Data *)PVar2.m_d.d;
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  ((long)local_88._M_unused._0_8_ + 8))->d = (Data *)PVar2.m_d.d;
  if (PVar2.m_d.d == (Data *)0x0) {
    pcStack_70 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
    pcStack_70 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)pcVar3,
             (function<void_(const_QList<int>_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  pcVar3 = local_b8.d.ptr;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_48,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_e0,
             (QPromiseResolve<QList<int>_> *)&local_c0,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)pcVar3,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_c0.d != (Data *)0x0) {
    LOCK();
    ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_c0.d != (Data *)0x0)) {
      operator_delete(local_c0.d,0x10);
    }
  }
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_e0.d != (Data *)0x0)) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b458;
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_b8.d.ptr);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_b8.d.ptr);
  }
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0014b428;
  if ((PromiseData<QList<int>_> *)local_b8.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_b8.d.ptr)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_b8.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_b8.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,4,8);
    }
  }
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  waitForError<QList<int>,QString>(&local_a0,&p,&local_b8);
  QVar6.m_data = (storage_type *)0x3;
  QVar6.m_size = (qsizetype)&local_60;
  QString::fromUtf8(QVar6);
  QVar7.m_data = local_a0.d.ptr;
  QVar7.m_size = local_a0.d.size;
  QVar8.m_data = local_58;
  QVar8.m_size = local_50;
  QTest::qCompare(QVar7,QVar8,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_filter.cpp"
                  ,0x77);
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,8);
    }
  }
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b428;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_filter::preserveOrder()
{
    auto p =
        QtPromise::QPromise<QVector<int>>::resolve({250, 50, 100, 400, 300}).filter([](int v, ...) {
            return QtPromise::QPromise<bool>::resolve(v > 200).delay(v);
        });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{250, 400, 300}));
}